

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

hash_code llvm::hashing::detail::
          hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           last)

{
  bool bVar1;
  char *buffer_end_00;
  reference puVar2;
  uint64_t uVar3;
  bool local_d1;
  bool local_c2;
  type_conflict4 local_c1;
  char *local_c0;
  size_t length;
  hash_state state;
  char *buffer_end;
  char *buffer_ptr;
  char buffer [64];
  uint64_t seed;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_local;
  
  seed = (uint64_t)last._M_current;
  last_local = first;
  buffer._56_8_ = get_execution_seed();
  buffer_end = (char *)&buffer_ptr;
  buffer_end_00 = std::end<char,64ul>((char (*) [64])&buffer_ptr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&seed);
    local_c2 = false;
    if (bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&last_local);
      state.h6._7_1_ = get_hashable_data<unsigned_char>(puVar2);
      local_c2 = store_and_advance<unsigned_char>
                           (&buffer_end,buffer_end_00,(uchar *)((long)&state.h6 + 7),0);
    }
    if (local_c2 == false) break;
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&last_local);
  }
  bVar1 = __gnu_cxx::operator==
                    (&last_local,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&seed);
  if (bVar1) {
    uVar3 = hash_short((char *)&buffer_ptr,(long)buffer_end - (long)&buffer_ptr,buffer._56_8_);
    hash_code::hash_code((hash_code *)&first_local,uVar3);
  }
  else {
    if (buffer_end != buffer_end_00) {
      __assert_fail("buffer_ptr == buffer_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Hashing.h"
                    ,0x1a0,
                    "hash_code llvm::hashing::detail::hash_combine_range_impl(InputIteratorT, InputIteratorT) [InputIteratorT = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                   );
    }
    hash_state::create((hash_state *)&length,(char *)&buffer_ptr,buffer._56_8_);
    local_c0 = (char *)0x40;
    while (bVar1 = __gnu_cxx::operator!=
                             (&last_local,
                              (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&seed), bVar1) {
      buffer_end = (char *)&buffer_ptr;
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&last_local,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&seed);
        local_d1 = false;
        if (bVar1) {
          puVar2 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&last_local);
          local_c1 = get_hashable_data<unsigned_char>(puVar2);
          local_d1 = store_and_advance<unsigned_char>(&buffer_end,buffer_end_00,&local_c1,0);
        }
        if (local_d1 == false) break;
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&last_local);
      }
      std::_V2::rotate<char*>((char *)&buffer_ptr,buffer_end,buffer_end_00);
      hash_state::mix((hash_state *)&length,(char *)&buffer_ptr);
      local_c0 = buffer_end + ((long)local_c0 - (long)&buffer_ptr);
    }
    uVar3 = hash_state::finalize((hash_state *)&length,(size_t)local_c0);
    hash_code::hash_code((hash_code *)&first_local,uVar3);
  }
  return (hash_code)(size_t)first_local._M_current;
}

Assistant:

hash_code hash_combine_range_impl(InputIteratorT first, InputIteratorT last) {
  const uint64_t seed = get_execution_seed();
  char buffer[64], *buffer_ptr = buffer;
  char *const buffer_end = std::end(buffer);
  while (first != last && store_and_advance(buffer_ptr, buffer_end,
                                            get_hashable_data(*first)))
    ++first;
  if (first == last)
    return hash_short(buffer, buffer_ptr - buffer, seed);
  assert(buffer_ptr == buffer_end);

  hash_state state = state.create(buffer, seed);
  size_t length = 64;
  while (first != last) {
    // Fill up the buffer. We don't clear it, which re-mixes the last round
    // when only a partial 64-byte chunk is left.
    buffer_ptr = buffer;
    while (first != last && store_and_advance(buffer_ptr, buffer_end,
                                              get_hashable_data(*first)))
      ++first;

    // Rotate the buffer if we did a partial fill in order to simulate doing
    // a mix of the last 64-bytes. That is how the algorithm works when we
    // have a contiguous byte sequence, and we want to emulate that here.
    std::rotate(buffer, buffer_ptr, buffer_end);

    // Mix this chunk into the current state.
    state.mix(buffer);
    length += buffer_ptr - buffer;
  };

  return state.finalize(length);
}